

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O0

string * __thiscall
soul::CompileMessage::getFullDescription_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  bool bVar1;
  ulong uVar2;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined4 local_48;
  undefined1 local_38 [8];
  string filename;
  CompileMessage *this_local;
  
  filename.field_2._8_8_ = this;
  CodeLocation::getFilename_abi_cxx11_((string *)local_38,&this->location);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = hasPosition(this);
    if (bVar1) {
      getPositionString_abi_cxx11_(&local_88,this);
      std::operator+(&local_68,":",&local_88);
      std::__cxx11::string::operator+=((string *)local_38,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
    }
    std::operator+(&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   ": ");
    getSeverity_abi_cxx11_(&local_108,this);
    std::operator+(&local_c8,&local_e8,&local_108);
    std::operator+(&local_a8,&local_c8,": ");
    std::operator+(__return_storage_ptr__,&local_a8,&this->description);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  else {
    getFullDescriptionWithoutFilename_abi_cxx11_(__return_storage_ptr__,this);
  }
  local_48 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getFullDescription() const
{
    auto filename = location.getFilename();

    if (filename.empty())
        return getFullDescriptionWithoutFilename();

    if (hasPosition())
        filename += ":" + getPositionString();

    return filename + ": " + getSeverity() + ": " + description;
}